

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  undefined8 in_RAX;
  cTValue *pcVar1;
  int size;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  pcVar1 = lj_debug_frame(L,level,&local_24);
  if (pcVar1 == (cTValue *)0x0) {
    local_24 = level - local_24;
  }
  else {
    local_24 = (int)((long)pcVar1 - (ulong)(L->stack).ptr32 >> 3) + local_24 * 0x10000;
  }
  ar->i_ci = local_24;
  return (uint)(pcVar1 != (cTValue *)0x0);
}

Assistant:

LUA_API int lua_getstack(lua_State *L, int level, lua_Debug *ar)
{
  int size;
  cTValue *frame = lj_debug_frame(L, level, &size);
  if (frame) {
    ar->i_ci = (size << 16) + (int)(frame - tvref(L->stack));
    return 1;
  } else {
    ar->i_ci = level - size;
    return 0;
  }
}